

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O2

void __thiscall t_json_generator::write_key_and_integer(t_json_generator *this,string *key,int val)

{
  ostream *poVar1;
  t_json_generator *this_00;
  string sStack_68;
  string local_48;
  
  write_comma_if_needed(this);
  this_00 = (t_json_generator *)&this->f_json_;
  poVar1 = t_generator::indent(&this->super_t_generator,(ostream *)this_00);
  json_str(&local_48,this_00,key);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,": ");
  number_to_string<int>(&sStack_68,this,val);
  std::operator<<(poVar1,(string *)&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  indicate_comma_needed(this);
  return;
}

Assistant:

void t_json_generator::write_key_and_integer(string key, int val) {
  write_comma_if_needed();
  indent(f_json_) << json_str(key) << ": " << number_to_string(val);
  indicate_comma_needed();
}